

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O3

void __thiscall
crypto::iterated_hash<crypto::md5_transform>::finalize
          (iterated_hash<crypto::md5_transform> *this,char *result)

{
  uint uVar1;
  hash_word hVar2;
  undefined8 uVar3;
  
  pad(this,0x38,-0x80);
  uVar1 = this->count_lo;
  hVar2 = this->count_hi;
  *(uint *)(this->buffer + 0x38) = uVar1 * 8;
  *(hash_word *)(this->buffer + 0x3c) = hVar2 << 3 | uVar1 >> 0x1d;
  hash(this->state,this->buffer,0x40);
  uVar3 = *(undefined8 *)(this->state + 2);
  *(undefined8 *)result = *(undefined8 *)this->state;
  *(undefined8 *)(result + 8) = uVar3;
  return;
}

Assistant:

void iterated_hash<T>::finalize(char * result) {
	
	size_t order = transform::offset * sizeof(hash_word);
	
	size_t size = block_size - 2 * sizeof(hash_word);
	pad(size);
	byte_order::store(bit_count_lo(), buffer + size + order);
	byte_order::store(bit_count_hi(), buffer + size + sizeof(hash_word) - order);
	
	hash(state, buffer, block_size);
	
	byte_order::store(state, hash_size, result);
	
}